

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
ProcessorGenerator::generate_dispatch_call(ProcessorGenerator *this,bool template_protocol)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  char *pcVar4;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70 [8];
  string function_suffix;
  allocator local_39;
  string local_38 [8];
  string protocol;
  bool template_protocol_local;
  ProcessorGenerator *this_local;
  
  protocol.field_2._M_local_buf[0xf] = template_protocol;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"::apache::thrift::protocol::TProtocol",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::__cxx11::string::string(local_70);
  if ((protocol.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::operator=(local_38,"Protocol_");
    std::__cxx11::string::operator=(local_70,"Templated");
  }
  poVar2 = std::operator<<(this->f_out_,(string *)&this->template_header_);
  poVar2 = std::operator<<(poVar2,(string *)&this->ret_type_);
  poVar2 = std::operator<<(poVar2,(string *)&this->class_name_);
  poVar2 = std::operator<<(poVar2,(string *)&this->template_suffix_);
  poVar2 = std::operator<<(poVar2,"::dispatchCall");
  poVar2 = std::operator<<(poVar2,local_70);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,(string *)&this->finish_cob_);
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"* iprot, ");
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"* oprot, ");
  poVar2 = std::operator<<(poVar2,"const std::string& fname, int32_t seqid");
  poVar2 = std::operator<<(poVar2,(string *)&this->call_context_);
  poVar2 = std::operator<<(poVar2,") {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_up(this);
  poVar2 = this->f_out_;
  indent_abi_cxx11_(&local_90,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  poVar2 = std::operator<<(poVar2,(string *)&this->typename_str_);
  poVar2 = std::operator<<(poVar2,"ProcessMap::iterator pfn;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_b0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  poVar2 = std::operator<<(poVar2,"pfn = processMap_.find(fname);");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_abi_cxx11_(&local_d0,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2,"if (pfn == processMap_.end()) {");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    poVar2 = this->f_out_;
    indent_abi_cxx11_(&local_230,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_230);
    poVar2 = std::operator<<(poVar2,"  return ");
    poVar2 = std::operator<<(poVar2,(string *)&this->extends_);
    poVar2 = std::operator<<(poVar2,"::dispatchCall(");
    bVar1 = std::operator==(&this->style_,"Cob");
    pcVar4 = "";
    if (bVar1) {
      pcVar4 = "cob, ";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    poVar2 = std::operator<<(poVar2,"iprot, oprot, fname, seqid");
    poVar2 = std::operator<<(poVar2,(string *)&this->call_context_arg_);
    poVar2 = std::operator<<(poVar2,");");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_230);
  }
  else {
    poVar2 = this->f_out_;
    indent_abi_cxx11_(&local_f0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    poVar2 = std::operator<<(poVar2,"  iprot->skip(::apache::thrift::protocol::T_STRUCT);");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_110,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_110);
    poVar2 = std::operator<<(poVar2,"  iprot->readMessageEnd();");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_130,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_130);
    poVar2 = std::operator<<(poVar2,"  iprot->getTransport()->readEnd();");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_150,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_150);
    poVar2 = std::operator<<(poVar2,
                             "  ::apache::thrift::TApplicationException x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, \"Invalid method name: \'\"+fname+\"\'\");"
                            );
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_170,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_170);
    poVar2 = std::operator<<(poVar2,
                             "  oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);"
                            );
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_190,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_190);
    poVar2 = std::operator<<(poVar2,"  x.write(oprot);");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_1b0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_1b0);
    poVar2 = std::operator<<(poVar2,"  oprot->writeMessageEnd();");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_1d0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d0);
    poVar2 = std::operator<<(poVar2,"  oprot->getTransport()->writeEnd();");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_1f0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
    poVar2 = std::operator<<(poVar2,"  oprot->getTransport()->flush();");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    indent_abi_cxx11_(&local_210,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_210);
    bVar1 = std::operator==(&this->style_,"Cob");
    pcVar4 = "  return true;";
    if (bVar1) {
      pcVar4 = "  return cob(true);";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  poVar2 = this->f_out_;
  indent_abi_cxx11_(&local_250,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_250);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_250);
  if ((protocol.field_2._M_local_buf[0xf] & 1U) == 0) {
    if ((this->generator_->gen_templates_only_ & 1U) == 0) {
      if ((this->generator_->gen_templates_ & 1U) == 0) {
        poVar2 = this->f_out_;
        indent_abi_cxx11_(&local_2d0,this);
        poVar2 = std::operator<<(poVar2,(string *)&local_2d0);
        std::operator<<(poVar2,"(this->*(pfn->second))");
        std::__cxx11::string::~string((string *)&local_2d0);
      }
      else {
        poVar2 = this->f_out_;
        indent_abi_cxx11_(&local_2b0,this);
        poVar2 = std::operator<<(poVar2,(string *)&local_2b0);
        std::operator<<(poVar2,"(this->*(pfn->second.generic))");
        std::__cxx11::string::~string((string *)&local_2b0);
      }
    }
    else {
      poVar2 = this->f_out_;
      indent_abi_cxx11_(&local_290,this);
      poVar2 = std::operator<<(poVar2,(string *)&local_290);
      std::operator<<(poVar2,"(this->*(pfn->second.generic))");
      std::__cxx11::string::~string((string *)&local_290);
    }
  }
  else {
    poVar2 = this->f_out_;
    indent_abi_cxx11_(&local_270,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_270);
    std::operator<<(poVar2,"(this->*(pfn->second.specialized))");
    std::__cxx11::string::~string((string *)&local_270);
  }
  poVar2 = std::operator<<(this->f_out_,"(");
  poVar2 = std::operator<<(poVar2,(string *)&this->cob_arg_);
  poVar2 = std::operator<<(poVar2,"seqid, iprot, oprot");
  poVar2 = std::operator<<(poVar2,(string *)&this->call_context_arg_);
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  bVar1 = std::operator==(&this->style_,"Cob");
  if (bVar1) {
    poVar2 = this->f_out_;
    indent_abi_cxx11_(&local_2f0,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_2f0);
    poVar2 = std::operator<<(poVar2,"return;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  else {
    poVar2 = this->f_out_;
    indent_abi_cxx11_(&local_310,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_310);
    poVar2 = std::operator<<(poVar2,"return true;");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_310);
  }
  indent_down(this);
  poVar2 = std::operator<<(this->f_out_,"}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ProcessorGenerator::generate_dispatch_call(bool template_protocol) {
  string protocol = "::apache::thrift::protocol::TProtocol";
  string function_suffix;
  if (template_protocol) {
    protocol = "Protocol_";
    // We call the generic version dispatchCall(), and the specialized
    // version dispatchCallTemplated().  We can't call them both
    // dispatchCall(), since this will cause the compiler to issue a warning if
    // a service that doesn't use templates inherits from a service that does
    // use templates: the compiler complains that the subclass only implements
    // the generic version of dispatchCall(), and hides the templated version.
    // Using different names for the two functions prevents this.
    function_suffix = "Templated";
  }

  f_out_ << template_header_ << ret_type_ << class_name_ << template_suffix_ << "::dispatchCall"
         << function_suffix << "(" << finish_cob_ << protocol << "* iprot, " << protocol
         << "* oprot, "
         << "const std::string& fname, int32_t seqid" << call_context_ << ") {" << endl;
  indent_up();

  // HOT: member function pointer map
  f_out_ << indent() << typename_str_ << "ProcessMap::iterator pfn;" << endl << indent()
         << "pfn = processMap_.find(fname);" << endl << indent()
         << "if (pfn == processMap_.end()) {" << endl;
  if (extends_.empty()) {
    f_out_ << indent() << "  iprot->skip(::apache::thrift::protocol::T_STRUCT);" << endl << indent()
           << "  iprot->readMessageEnd();" << endl << indent()
           << "  iprot->getTransport()->readEnd();" << endl << indent()
           << "  ::apache::thrift::TApplicationException "
              "x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, \"Invalid method name: "
              "'\"+fname+\"'\");" << endl << indent()
           << "  oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);"
           << endl << indent() << "  x.write(oprot);" << endl << indent()
           << "  oprot->writeMessageEnd();" << endl << indent()
           << "  oprot->getTransport()->writeEnd();" << endl << indent()
           << "  oprot->getTransport()->flush();" << endl << indent()
           << (style_ == "Cob" ? "  return cob(true);" : "  return true;") << endl;
  } else {
    f_out_ << indent() << "  return " << extends_ << "::dispatchCall("
           << (style_ == "Cob" ? "cob, " : "") << "iprot, oprot, fname, seqid" << call_context_arg_
           << ");" << endl;
  }
  f_out_ << indent() << "}" << endl;
  if (template_protocol) {
    f_out_ << indent() << "(this->*(pfn->second.specialized))";
  } else {
    if (generator_->gen_templates_only_) {
      // TODO: This is a null pointer, so nothing good will come from calling
      // it.  Throw an exception instead.
      f_out_ << indent() << "(this->*(pfn->second.generic))";
    } else if (generator_->gen_templates_) {
      f_out_ << indent() << "(this->*(pfn->second.generic))";
    } else {
      f_out_ << indent() << "(this->*(pfn->second))";
    }
  }
  f_out_ << "(" << cob_arg_ << "seqid, iprot, oprot" << call_context_arg_ << ");" << endl;

  // TODO(dreiss): return pfn ret?
  if (style_ == "Cob") {
    f_out_ << indent() << "return;" << endl;
  } else {
    f_out_ << indent() << "return true;" << endl;
  }

  indent_down();
  f_out_ << "}" << endl << endl;
}